

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O0

ssize_t Omega_h::gmsh::write(int __fd,void *__buf,size_t __n)

{
  void **this;
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  I32 IVar4;
  LO LVar5;
  Omega_h_Family OVar6;
  _Setprecision _Var7;
  Omega_h_Family family_00;
  Int IVar8;
  element_type *this_00;
  ostream *poVar9;
  double *pdVar10;
  char *pcVar11;
  int *piVar12;
  ssize_t extraout_RAX;
  undefined4 in_register_0000003c;
  int local_2f4;
  int local_2e4;
  int local_2d8;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2b8;
  int local_2ac;
  int local_2a4;
  int local_208;
  Int j_2;
  int class_id;
  LO i_2;
  Int deg;
  undefined1 local_1e8 [8];
  HostRead<int> h_ents2verts;
  undefined1 local_1c8 [8];
  HostRead<signed_char> h_class_dims_1;
  undefined1 local_1a8 [8];
  HostRead<int> h_class_ids;
  LOs d_ents2verts;
  string local_180 [32];
  undefined1 local_160 [8];
  Read<signed_char> d_class_dims_1;
  string local_148 [32];
  undefined1 local_128 [8];
  Read<int> d_class_ids;
  LO nents_1;
  Int ent_dim_1;
  LO gmsh_nelems;
  LO i_1;
  HostRead<signed_char> h_class_dims;
  string local_e0 [32];
  undefined1 local_c0 [8];
  Read<signed_char> d_class_dims;
  LO nents;
  Int ent_dim;
  Omega_h_Family family;
  LO gmsh_elem_i;
  Int j_1;
  Int j;
  LO i;
  undefined1 local_80 [8];
  HostRead<double> h_coords;
  Reals d_coords;
  Int dim;
  LO nverts;
  undefined1 local_48 [24];
  Mesh *mesh_local;
  ostream *stream_local;
  uint local_20;
  Omega_h_Family local_1c;
  undefined4 local_18;
  uint local_14;
  undefined4 local_10;
  uint local_c;
  
  mesh_local = (Mesh *)CONCAT44(in_register_0000003c,__fd);
  local_48._16_8_ = __buf;
  Omega_h::Mesh::comm((Mesh *)local_48);
  this_00 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_48);
  IVar4 = Comm::size(this_00);
  if (IVar4 == 1) {
    std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_48);
    std::operator<<((ostream *)mesh_local,"$MeshFormat\n");
    poVar9 = std::operator<<((ostream *)mesh_local,"2.2 0 ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,8);
    std::operator<<(poVar9,'\n');
    std::operator<<((ostream *)mesh_local,"$EndMeshFormat\n");
    std::operator<<((ostream *)mesh_local,"$Nodes\n");
    LVar5 = Omega_h::Mesh::nverts((Mesh *)local_48._16_8_);
    poVar9 = (ostream *)std::ostream::operator<<(mesh_local,LVar5);
    std::operator<<(poVar9,'\n');
    OVar6 = Omega_h::Mesh::dim((Mesh *)local_48._16_8_);
    this = &h_coords.read_.write_.shared_alloc_.direct_ptr;
    Omega_h::Mesh::coords((Mesh *)this);
    Read<double>::Read((Read<double> *)&i,(Read<double> *)this);
    HostRead<double>::HostRead((HostRead<double> *)local_80,(Read<signed_char> *)&i);
    Read<double>::~Read((Read<double> *)&i);
    poVar9 = (ostream *)std::ostream::operator<<(mesh_local,std::scientific);
    _Var7 = std::setprecision(0x11);
    std::operator<<(poVar9,_Var7);
    for (j_1 = 0; j_1 < LVar5; j_1 = j_1 + 1) {
      std::ostream::operator<<(mesh_local,j_1 + 1);
      for (gmsh_elem_i = 0; family = OVar6, gmsh_elem_i < (int)OVar6; gmsh_elem_i = gmsh_elem_i + 1)
      {
        poVar9 = std::operator<<((ostream *)mesh_local,' ');
        pdVar10 = HostRead<double>::operator[]
                            ((HostRead<double> *)local_80,j_1 * OVar6 + gmsh_elem_i);
        std::ostream::operator<<(poVar9,*pdVar10);
      }
      for (; (int)family < 3; family = family + OMEGA_H_HYPERCUBE) {
        std::operator<<((ostream *)mesh_local," 0");
      }
      std::operator<<((ostream *)mesh_local,'\n');
    }
    std::operator<<((ostream *)mesh_local,"$EndNodes\n");
    std::operator<<((ostream *)mesh_local,"$Elements\n");
    ent_dim = 0;
    family_00 = Omega_h::Mesh::family((Mesh *)local_48._16_8_);
    for (d_class_dims.write_.shared_alloc_.direct_ptr._4_4_ = 0;
        (int)d_class_dims.write_.shared_alloc_.direct_ptr._4_4_ <= (int)OVar6;
        d_class_dims.write_.shared_alloc_.direct_ptr._4_4_ =
             d_class_dims.write_.shared_alloc_.direct_ptr._4_4_ + 1) {
      d_class_dims.write_.shared_alloc_.direct_ptr._0_4_ =
           Omega_h::Mesh::nents
                     ((Mesh *)local_48._16_8_,d_class_dims.write_.shared_alloc_.direct_ptr._4_4_);
      uVar3 = local_48._16_8_;
      uVar2 = d_class_dims.write_.shared_alloc_.direct_ptr._4_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e0,"class_dim",
                 (allocator *)((long)&h_class_dims.read_.write_.shared_alloc_.direct_ptr + 7));
      Omega_h::Mesh::get_array<signed_char>((Mesh *)local_c0,(Int)uVar3,(string *)(ulong)uVar2);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&h_class_dims.read_.write_.shared_alloc_.direct_ptr + 7))
      ;
      Read<signed_char>::Read((Read<signed_char> *)&gmsh_nelems,(Read<signed_char> *)local_c0);
      HostRead<signed_char>::HostRead
                ((HostRead<signed_char> *)&stack0xffffffffffffff08,(Read<signed_char> *)&gmsh_nelems
                );
      Read<signed_char>::~Read((Read<signed_char> *)&gmsh_nelems);
      for (ent_dim_1 = 0; ent_dim_1 < (LO)d_class_dims.write_.shared_alloc_.direct_ptr;
          ent_dim_1 = ent_dim_1 + 1) {
        pcVar11 = HostRead<signed_char>::operator[]
                            ((HostRead<signed_char> *)&stack0xffffffffffffff08,ent_dim_1);
        if ((int)*pcVar11 == d_class_dims.write_.shared_alloc_.direct_ptr._4_4_) {
          ent_dim = ent_dim + 1;
        }
      }
      HostRead<signed_char>::~HostRead((HostRead<signed_char> *)&stack0xffffffffffffff08);
      Read<signed_char>::~Read((Read<signed_char> *)local_c0);
    }
    poVar9 = (ostream *)std::ostream::operator<<(mesh_local,ent_dim);
    std::operator<<(poVar9,'\n');
    ent_dim = 0;
    for (d_class_ids.write_.shared_alloc_.direct_ptr._4_4_ = 0;
        (int)d_class_ids.write_.shared_alloc_.direct_ptr._4_4_ <= (int)OVar6;
        d_class_ids.write_.shared_alloc_.direct_ptr._4_4_ =
             d_class_ids.write_.shared_alloc_.direct_ptr._4_4_ + 1) {
      d_class_ids.write_.shared_alloc_.direct_ptr._0_4_ =
           Omega_h::Mesh::nents
                     ((Mesh *)local_48._16_8_,d_class_ids.write_.shared_alloc_.direct_ptr._4_4_);
      uVar3 = local_48._16_8_;
      uVar2 = d_class_ids.write_.shared_alloc_.direct_ptr._4_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_148,"class_id",
                 (allocator *)((long)&d_class_dims_1.write_.shared_alloc_.direct_ptr + 7));
      Omega_h::Mesh::get_array<int>((Mesh *)local_128,(Int)uVar3,(string *)(ulong)uVar2);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&d_class_dims_1.write_.shared_alloc_.direct_ptr + 7));
      uVar3 = local_48._16_8_;
      uVar2 = d_class_ids.write_.shared_alloc_.direct_ptr._4_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_180,"class_dim",
                 (allocator *)((long)&d_ents2verts.write_.shared_alloc_.direct_ptr + 7));
      Omega_h::Mesh::get_array<signed_char>((Mesh *)local_160,(Int)uVar3,(string *)(ulong)uVar2);
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&d_ents2verts.write_.shared_alloc_.direct_ptr + 7));
      Omega_h::Mesh::ask_verts_of
                ((Mesh *)&h_class_ids.read_.write_.shared_alloc_.direct_ptr,(Int)local_48._16_8_);
      Read<int>::Read((Read<int> *)&h_class_dims_1.read_.write_.shared_alloc_.direct_ptr,
                      (Read<int> *)local_128);
      HostRead<int>::HostRead
                ((HostRead<int> *)local_1a8,
                 (Read<signed_char> *)&h_class_dims_1.read_.write_.shared_alloc_.direct_ptr);
      Read<int>::~Read((Read<int> *)&h_class_dims_1.read_.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::Read
                ((Read<signed_char> *)&h_ents2verts.read_.write_.shared_alloc_.direct_ptr,
                 (Read<signed_char> *)local_160);
      HostRead<signed_char>::HostRead
                ((HostRead<signed_char> *)local_1c8,
                 (Read<signed_char> *)&h_ents2verts.read_.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::~Read
                ((Read<signed_char> *)&h_ents2verts.read_.write_.shared_alloc_.direct_ptr);
      Read<int>::Read((Read<int> *)&i_2,
                      (Read<int> *)&h_class_ids.read_.write_.shared_alloc_.direct_ptr);
      HostRead<int>::HostRead((HostRead<int> *)local_1e8,(Read<signed_char> *)&i_2);
      Read<int>::~Read((Read<int> *)&i_2);
      local_20 = d_class_ids.write_.shared_alloc_.direct_ptr._4_4_;
      stream_local._4_4_ = 0;
      if (family_00 == OMEGA_H_SIMPLEX) {
        local_14 = d_class_ids.write_.shared_alloc_.direct_ptr._4_4_;
        local_18 = 0;
        if (d_class_ids.write_.shared_alloc_.direct_ptr._4_4_ == 0) {
          local_2a4 = 1;
        }
        else {
          if (d_class_ids.write_.shared_alloc_.direct_ptr._4_4_ == 1) {
            local_2ac = 2;
          }
          else {
            if (d_class_ids.write_.shared_alloc_.direct_ptr._4_4_ == 2) {
              local_2b8 = 3;
            }
            else {
              if (d_class_ids.write_.shared_alloc_.direct_ptr._4_4_ == 3) {
                local_2c8 = 4;
              }
              else {
                local_2c8 = -1;
              }
              local_2b8 = local_2c8;
            }
            local_2ac = local_2b8;
          }
          local_2a4 = local_2ac;
        }
        local_2cc = local_2a4;
      }
      else {
        local_c = d_class_ids.write_.shared_alloc_.direct_ptr._4_4_;
        local_10 = 0;
        if (d_class_ids.write_.shared_alloc_.direct_ptr._4_4_ == 0) {
          local_2d0 = 1;
        }
        else {
          if (d_class_ids.write_.shared_alloc_.direct_ptr._4_4_ == 1) {
            local_2d8 = 2;
          }
          else {
            if (d_class_ids.write_.shared_alloc_.direct_ptr._4_4_ == 2) {
              local_2e4 = 4;
            }
            else {
              if (d_class_ids.write_.shared_alloc_.direct_ptr._4_4_ == 3) {
                local_2f4 = 8;
              }
              else {
                local_2f4 = -1;
              }
              local_2e4 = local_2f4;
            }
            local_2d8 = local_2e4;
          }
          local_2d0 = local_2d8;
        }
        local_2cc = local_2d0;
      }
      local_1c = family_00;
      for (j_2 = 0; j_2 < (LO)d_class_ids.write_.shared_alloc_.direct_ptr; j_2 = j_2 + 1) {
        pcVar11 = HostRead<signed_char>::operator[]((HostRead<signed_char> *)local_1c8,j_2);
        if ((int)*pcVar11 == d_class_ids.write_.shared_alloc_.direct_ptr._4_4_) {
          ent_dim = ent_dim + 1;
          std::ostream::operator<<(mesh_local,ent_dim);
          poVar9 = std::operator<<((ostream *)mesh_local,' ');
          IVar8 = anon_unknown_0::gmsh_type
                            (family_00,d_class_ids.write_.shared_alloc_.direct_ptr._4_4_);
          std::ostream::operator<<(poVar9,IVar8);
          std::operator<<((ostream *)mesh_local," 2");
          piVar12 = HostRead<int>::operator[]((HostRead<int> *)local_1a8,j_2);
          iVar1 = *piVar12;
          poVar9 = std::operator<<((ostream *)mesh_local,' ');
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar1);
          poVar9 = std::operator<<(poVar9,' ');
          std::ostream::operator<<(poVar9,iVar1);
          for (local_208 = 0; local_208 < local_2cc; local_208 = local_208 + 1) {
            poVar9 = std::operator<<((ostream *)mesh_local,' ');
            piVar12 = HostRead<int>::operator[]
                                ((HostRead<int> *)local_1e8,j_2 * local_2cc + local_208);
            std::ostream::operator<<(poVar9,*piVar12 + 1);
          }
          std::operator<<((ostream *)mesh_local,'\n');
        }
      }
      HostRead<int>::~HostRead((HostRead<int> *)local_1e8);
      HostRead<signed_char>::~HostRead((HostRead<signed_char> *)local_1c8);
      HostRead<int>::~HostRead((HostRead<int> *)local_1a8);
      Read<int>::~Read((Read<int> *)&h_class_ids.read_.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::~Read((Read<signed_char> *)local_160);
      Read<int>::~Read((Read<int> *)local_128);
    }
    std::operator<<((ostream *)mesh_local,"$EndElements\n");
    HostRead<double>::~HostRead((HostRead<double> *)local_80);
    Read<double>::~Read((Read<double> *)&h_coords.read_.write_.shared_alloc_.direct_ptr);
    return extraout_RAX;
  }
  fail("assertion %s failed at %s +%d\n","mesh->comm()->size() == 1",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
       ,0x2c6);
}

Assistant:

void write(std::ostream& stream, Mesh* mesh) {
  OMEGA_H_CHECK(mesh->comm()->size() == 1);
  stream << "$MeshFormat\n";
  stream << "2.2 0 " << sizeof(Real) << '\n';
  stream << "$EndMeshFormat\n";
  stream << "$Nodes\n";
  auto nverts = mesh->nverts();
  stream << nverts << '\n';
  auto dim = mesh->dim();
  auto d_coords = mesh->coords();
  auto h_coords = HostRead<Real>(d_coords);
  stream << std::scientific << std::setprecision(17);
  for (LO i = 0; i < nverts; ++i) {
    stream << (i + 1);
    for (Int j = 0; j < dim; ++j) stream << ' ' << h_coords[i * dim + j];
    for (Int j = dim; j < 3; ++j) stream << " 0";
    stream << '\n';
  }
  stream << "$EndNodes\n";
  stream << "$Elements\n";
  LO gmsh_elem_i = 0;
  auto family = mesh->family();
  for (Int ent_dim = VERT; ent_dim <= dim; ++ent_dim) {
    auto nents = mesh->nents(ent_dim);
    auto d_class_dims = mesh->get_array<Byte>(ent_dim, "class_dim");
    auto h_class_dims = HostRead<Byte>(d_class_dims);
    for (LO i = 0; i < nents; ++i) {
      if (h_class_dims[i] == ent_dim) ++gmsh_elem_i;
    }
  }
  auto gmsh_nelems = gmsh_elem_i;
  stream << gmsh_nelems << '\n';
  gmsh_elem_i = 0;
  for (Int ent_dim = VERT; ent_dim <= dim; ++ent_dim) {
    auto nents = mesh->nents(ent_dim);
    auto d_class_ids = mesh->get_array<ClassId>(ent_dim, "class_id");
    auto d_class_dims = mesh->get_array<Byte>(ent_dim, "class_dim");
    auto d_ents2verts = mesh->ask_verts_of(ent_dim);
    auto h_class_ids = HostRead<ClassId>(d_class_ids);
    auto h_class_dims = HostRead<Byte>(d_class_dims);
    auto h_ents2verts = HostRead<LO>(d_ents2verts);
    auto deg = element_degree(family, ent_dim, VERT);
    for (LO i = 0; i < nents; ++i) {
      if (h_class_dims[i] != ent_dim) continue;
      stream << ++gmsh_elem_i;
      stream << ' ' << gmsh_type(family, ent_dim);
      stream << " 2";
      auto class_id = h_class_ids[i];
      stream << ' ' << class_id << ' ' << class_id;
      for (Int j = 0; j < deg; ++j) {
        stream << ' ' << (h_ents2verts[i * deg + j] + 1);
      }
      stream << '\n';
    }
  }
  stream << "$EndElements\n";
}